

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
Plan::AddSubTarget(Plan *this,Node *node,Node *dependent,string *err,
                  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *dyndep_walk)

{
  Edge *edge_00;
  bool bVar1;
  iterator want_e;
  uint uVar2;
  pointer ppNVar4;
  bool bVar5;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>,_bool> pVar6;
  Edge *edge;
  string referenced;
  Edge *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong uVar3;
  
  edge_00 = node->in_edge_;
  local_d8 = edge_00;
  if (edge_00 == (Edge *)0x0) {
    if (node->dirty_ == true) {
      local_b0._0_8_ = local_b0 + 0x10;
      local_b0._8_8_ = 0;
      local_b0[0x10] = '\0';
      if (dependent != (Node *)0x0) {
        std::operator+(&local_d0,", needed by \'",&dependent->path_);
        std::operator+(&local_50,&local_d0,"\',");
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      std::operator+(&local_90,"\'",&node->path_);
      std::operator+(&local_70,&local_90,"\'");
      std::operator+(&local_d0,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      std::operator+(&local_50,&local_d0," missing and no known rule to make it");
      std::__cxx11::string::operator=((string *)err,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)local_b0);
    }
    return false;
  }
  if (edge_00->outputs_ready_ != false) {
    return false;
  }
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffff00000000;
  local_b0._0_8_ = edge_00;
  pVar6 = std::
          _Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
          ::_M_emplace_unique<std::pair<Edge*,Plan::Want>>
                    ((_Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                      *)this,(pair<Edge_*,_Plan::Want> *)local_b0);
  uVar3 = pVar6._8_8_;
  uVar2 = pVar6._8_4_;
  want_e._M_node = (_Base_ptr)pVar6.first._M_node;
  if ((dyndep_walk != (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) &&
     (*(int *)&want_e._M_node[1]._M_parent == 2)) {
    return false;
  }
  if ((node->dirty_ == true) && (*(int *)&want_e._M_node[1]._M_parent == 0)) {
    *(undefined4 *)&want_e._M_node[1]._M_parent = 1;
    bVar5 = pVar6.second;
    EdgeWanted(this,edge_00);
    uVar2 = (uint)bVar5;
    if (dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) {
      bVar1 = Edge::AllInputsReady(edge_00);
      uVar3 = (ulong)bVar5;
      if (bVar1) {
        ScheduleWork(this,want_e);
        uVar3 = (ulong)bVar5;
      }
      goto LAB_0010a982;
    }
  }
  else if (dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0)
  goto LAB_0010a982;
  uVar3 = (ulong)uVar2;
  std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
  _M_insert_unique<Edge*const&>
            ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *)
             dyndep_walk,&local_d8);
LAB_0010a982:
  if ((uVar3 & 1) == 0) {
    return true;
  }
  ppNVar4 = (local_d8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    bVar5 = ppNVar4 ==
            (local_d8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar5) {
      return bVar5;
    }
    bVar1 = AddSubTarget(this,*ppNVar4,node,err,dyndep_walk);
    if ((!bVar1) && (err->_M_string_length != 0)) break;
    ppNVar4 = ppNVar4 + 1;
  }
  return bVar5;
}

Assistant:

bool Plan::AddSubTarget(const Node* node, const Node* dependent, string* err,
                        set<Edge*>* dyndep_walk) {
  Edge* edge = node->in_edge();
  if (!edge) {  // Leaf node.
    if (node->dirty()) {
      string referenced;
      if (dependent)
        referenced = ", needed by '" + dependent->path() + "',";
      *err = "'" + node->path() + "'" + referenced + " missing "
             "and no known rule to make it";
    }
    return false;
  }

  if (edge->outputs_ready())
    return false;  // Don't need to do anything.

  // If an entry in want_ does not already exist for edge, create an entry which
  // maps to kWantNothing, indicating that we do not want to build this entry itself.
  pair<map<Edge*, Want>::iterator, bool> want_ins =
    want_.insert(make_pair(edge, kWantNothing));
  Want& want = want_ins.first->second;

  if (dyndep_walk && want == kWantToFinish)
    return false;  // Don't need to do anything with already-scheduled edge.

  // If we do need to build edge and we haven't already marked it as wanted,
  // mark it now.
  if (node->dirty() && want == kWantNothing) {
    want = kWantToStart;
    EdgeWanted(edge);
    if (!dyndep_walk && edge->AllInputsReady())
      ScheduleWork(want_ins.first);
  }

  if (dyndep_walk)
    dyndep_walk->insert(edge);

  if (!want_ins.second)
    return true;  // We've already processed the inputs.

  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    if (!AddSubTarget(*i, node, err, dyndep_walk) && !err->empty())
      return false;
  }

  return true;
}